

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

Offset dg::pta::accumulateEVOffsets(ExtractValueInst *EV,DataLayout *DL)

{
  Value *this;
  uint64_t o;
  ulong uVar1;
  long lVar2;
  StructType *in_RSI;
  TypeSize TVar3;
  VectorType *vecTy;
  ArrayType *arrTy;
  StructLayout *SL;
  StructType *STy;
  uint idx;
  iterator __end2;
  iterator __begin2;
  ArrayRef<unsigned_int> *__range2;
  Type *type;
  Offset off;
  Type *in_stack_ffffffffffffff20;
  StructType *in_stack_ffffffffffffff28;
  StructLayout *in_stack_ffffffffffffff30;
  Type *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Offset local_a8;
  ret_type local_a0;
  ScalarTy local_98;
  uint local_90;
  TypeSize local_88;
  Offset local_78;
  ret_type local_70;
  Offset local_68;
  undefined8 local_60;
  ret_type local_58;
  value_type_conflict2 local_4c;
  iterator local_48;
  iterator local_40;
  ArrayRef<unsigned_int> local_38;
  ArrayRef<unsigned_int> *local_28;
  Type *local_20;
  StructType *local_18;
  Offset local_8;
  
  local_18 = in_RSI;
  Offset::Offset(&local_8,0);
  this = llvm::ExtractValueInst::getAggregateOperand((ExtractValueInst *)0x1b7365);
  local_20 = llvm::Value::getType(this);
  local_38 = llvm::ExtractValueInst::getIndices((ExtractValueInst *)0x1b7382);
  local_28 = &local_38;
  local_40 = llvm::ArrayRef<unsigned_int>::begin(local_28);
  local_48 = llvm::ArrayRef<unsigned_int>::end(local_28);
  while( true ) {
    if (local_40 == local_48) {
      return (Offset)local_8.offset;
    }
    local_4c = *local_40;
    local_58 = llvm::dyn_cast<llvm::StructType,llvm::Type>(in_stack_ffffffffffffff20);
    if (local_58 == (ret_type)0x0) {
      local_70 = llvm::dyn_cast<llvm::ArrayType,llvm::Type>(in_stack_ffffffffffffff20);
      if (local_70 == (ret_type)0x0) {
        local_a0 = llvm::cast<llvm::VectorType,llvm::Type>((Type *)0x1b7513);
        in_stack_ffffffffffffff20 = (Type *)(ulong)local_4c;
        llvm::VectorType::getElementType(local_a0);
        TVar3 = llvm::DataLayout::getTypeAllocSize
                          ((DataLayout *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff48 =
             TVar3.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        in_stack_ffffffffffffff50 =
             TVar3.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        uVar1 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&stack0xffffffffffffff48)
        ;
        Offset::Offset(&local_a8,(type)(in_stack_ffffffffffffff20 + uVar1));
        Offset::operator+=(&local_8,local_a8);
      }
      else {
        in_stack_ffffffffffffff30 = (StructLayout *)(ulong)local_4c;
        in_stack_ffffffffffffff28 = local_18;
        llvm::ArrayType::getElementType(local_70);
        TVar3 = llvm::DataLayout::getTypeAllocSize
                          ((DataLayout *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48);
        local_98 = TVar3.super_LinearPolySize<llvm::TypeSize>.
                   super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        local_90 = TVar3.super_LinearPolySize<llvm::TypeSize>.
                   super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        local_88.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
        .Value = local_98;
        local_88.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
        .UnivariateDim = local_90;
        uVar1 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_88);
        Offset::Offset(&local_78,(type)(in_stack_ffffffffffffff30 + uVar1));
        Offset::operator+=(&local_8,local_78);
      }
    }
    else {
      local_60 = llvm::DataLayout::getStructLayout(local_18);
      o = llvm::StructLayout::getElementOffset
                    (in_stack_ffffffffffffff30,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      Offset::Offset(&local_68,o);
      Offset::operator+=(&local_8,local_68);
    }
    lVar2 = llvm::GetElementPtrInst::getTypeAtIndex(local_20,(ulong)local_4c);
    if (lVar2 == 0) break;
    local_40 = local_40 + 1;
  }
  return (Offset)local_8.offset;
}

Assistant:

Offset accumulateEVOffsets(const llvm::ExtractValueInst *EV,
                           const llvm::DataLayout &DL) {
    Offset off{0};
#if LLVM_VERSION_MAJOR >= 11
    llvm::Type *type = EV->getAggregateOperand()->getType();
#else
    llvm::CompositeType *type = llvm::dyn_cast<llvm::CompositeType>(
            EV->getAggregateOperand()->getType());
    assert(type && "Don't have composite type in extractvalue");
#endif

    for (unsigned idx : EV->getIndices()) {
        if (llvm::StructType *STy = llvm::dyn_cast<llvm::StructType>(type)) {
            assert(STy->indexValid(idx) && "Invalid index");
            const llvm::StructLayout *SL = DL.getStructLayout(STy);
            off += SL->getElementOffset(idx);
        } else {
            // array or vector, so just move in the array
            if (auto *arrTy = llvm::dyn_cast<llvm::ArrayType>(type)) {
                assert(idx < arrTy->getNumElements() && "Invalid index");
                off += idx + DL.getTypeAllocSize(arrTy->getElementType());
            } else {
                auto *vecTy = llvm::cast<llvm::VectorType>(type);
#if LLVM_VERSION_MAJOR >= 12
                assert(idx < vecTy->getElementCount().getFixedValue() &&
                       "Invalid index");
#else
                assert(idx < vecTy->getNumElements() && "Invalid index");
#endif
                off += idx + DL.getTypeAllocSize(vecTy->getElementType());
            }
        }

#if LLVM_VERSION_MAJOR >= 11
        if (!llvm::GetElementPtrInst::getTypeAtIndex(type, idx))
#else
        if (!llvm::dyn_cast<llvm::CompositeType>(type->getTypeAtIndex(idx)))
#endif
            break; // we're done
    }

    return off;
}